

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_x25519.cc
# Opt level: O2

int pkey_x25519_ctrl(EVP_PKEY_CTX *ctx,int type,int p1,void *p2)

{
  if (type != 3) {
    ERR_put_error(6,0,0x65,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_x25519.cc"
                  ,0x58);
  }
  return (uint)(type == 3);
}

Assistant:

static int pkey_x25519_ctrl(EVP_PKEY_CTX *ctx, int type, int p1, void *p2) {
  switch (type) {
    case EVP_PKEY_CTRL_PEER_KEY:
      // |EVP_PKEY_derive_set_peer| requires the key implement this command,
      // even if it is a no-op.
      return 1;

    default:
      OPENSSL_PUT_ERROR(EVP, EVP_R_COMMAND_NOT_SUPPORTED);
      return 0;
  }
}